

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

Result __thiscall
doctest::detail::Expression_lhs<std::__cxx11::string_const&>::operator==
          (Expression_lhs<std::__cxx11::string_const&> *this,char (*rhs) [141])

{
  bool passed;
  char *in_RAX;
  char (*in_RDX) [141];
  String extraout_RDX;
  Result RVar1;
  String local_28;
  
  local_28.m_str = in_RAX;
  passed = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            *rhs,*in_RDX);
  stringifyBinaryExpr<std::__cxx11::string,char[141]>
            ((detail *)&local_28,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*rhs," == ",
             in_RDX);
  Result::Result((Result *)this,passed,&local_28);
  free(local_28.m_str);
  RVar1.m_decomposition.m_str = extraout_RDX.m_str;
  RVar1._0_8_ = this;
  return RVar1;
}

Assistant:

Result operator==(const DOCTEST_REF_WRAP(R) rhs) { return Result(lhs == rhs, stringifyBinaryExpr(lhs, " == ", rhs)); }